

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O2

size_t std::experimental::detail::index_into_dynamic_dims<unsigned_long,unsigned_long,unsigned_long>
                 (unsigned_long idx,unsigned_long head,unsigned_long tail)

{
  if (idx != 0 && head == 0xffffffffffffffff) {
    return (ulong)(idx != 1 && tail == 0xffffffffffffffff) + 1;
  }
  return (ulong)(1 < idx && tail == 0xffffffffffffffff);
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}